

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::
best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
::mutation(best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
           *this,local_context *ctx,bit_array *x)

{
  baryonyx *pbVar1;
  int index;
  result_type_conflict2 rVar2;
  double *args;
  double dVar3;
  string_view fmt;
  string_view fmt_00;
  double *in_stack_ffffffffffffff68;
  bool local_6a;
  bool local_69;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  int local_58;
  int local_54;
  int e;
  int i;
  bernoulli_distribution dist_value_p;
  bernoulli_distribution dist_var_p;
  char *local_38;
  result_type local_30;
  double var_p;
  double val_p;
  bit_array *x_local;
  local_context *ctx_local;
  best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
  *this_local;
  
  val_p = (double)x;
  x_local = (bit_array *)ctx;
  ctx_local = (local_context *)this;
  dVar3 = std::normal_distribution<double>::mean(&ctx->value_p_dist);
  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
    dVar3 = std::normal_distribution<double>::stddev
                      ((normal_distribution<double> *)&x_local[4].super_bit_array_impl.m_data);
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
      return;
    }
  }
  do {
    local_30 = std::normal_distribution<double>::operator()
                         ((normal_distribution<double> *)&x_local[2].super_bit_array_impl.m_data,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          x_local);
    local_69 = local_30 <= 0.0 || 1.0 <= local_30;
  } while (local_69);
  do {
    var_p = std::normal_distribution<double>::operator()
                      ((normal_distribution<double> *)&x_local[4].super_bit_array_impl.m_data,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       x_local);
    pbVar1 = _stdout;
    local_6a = var_p < 0.0 || 1.0 < var_p;
  } while (local_6a);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&dist_var_p,
             "- mutation variables {}% with  {}% of set\n");
  args = &var_p;
  fmt._M_str = (char *)&local_30;
  fmt._M_len = (size_t)local_38;
  to_log<double,double>
            (pbVar1,(FILE *)0x7,dist_var_p._M_param._M_p._0_4_,fmt,args,in_stack_ffffffffffffff68);
  std::bernoulli_distribution::bernoulli_distribution(&dist_value_p,local_30);
  std::bernoulli_distribution::bernoulli_distribution((bernoulli_distribution *)&e,var_p);
  local_54 = 0;
  local_58 = bit_array_impl::size((bit_array_impl *)val_p);
  for (; local_54 != local_58; local_54 = local_54 + 1) {
    rVar2 = std::bernoulli_distribution::operator()
                      (&dist_value_p,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       x_local);
    pbVar1 = _stdout;
    if (rVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_68,"- mutate variable {}\n");
      fmt_00._M_str = (char *)&local_54;
      fmt_00._M_len = (size_t)local_68._M_str;
      to_log<int>(pbVar1,(FILE *)0x9,(uint)local_68._M_len,fmt_00,(int *)args);
      dVar3 = val_p;
      index = local_54;
      rVar2 = std::bernoulli_distribution::operator()
                        ((bernoulli_distribution *)&e,
                         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         x_local);
      bit_array_impl::set((bit_array_impl *)dVar3,index,rVar2);
    }
  }
  return;
}

Assistant:

void mutation(local_context& ctx, bit_array& x)
    {
        if (ctx.value_p_dist.mean() == 0.0 && ctx.value_p_dist.stddev() == 0.0)
            return;

        double val_p, var_p;

        do
            var_p = ctx.variable_p_dist(ctx.rng);
        while (var_p <= 0.0 || var_p >= 1.0);

        do
            val_p = ctx.value_p_dist(ctx.rng);
        while (val_p < 0.0 || val_p > 1.0);

        to_log(stdout,
               7u,
               "- mutation variables {}% with "
               " {}% of set\n",
               var_p,
               val_p);

        std::bernoulli_distribution dist_var_p(var_p);
        std::bernoulli_distribution dist_value_p(val_p);

        for (int i = 0, e = x.size(); i != e; ++i) {
            if (dist_var_p(ctx.rng)) {
                to_log(stdout, 9u, "- mutate variable {}\n", i);

                x.set(i, dist_value_p(ctx.rng));
            }
        }
    }